

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O3

void NULLCCanvas::CanvasDrawRect(int x1,int y1,int x2,int y2,Canvas *ptr)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  float *pfVar7;
  
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
    return;
  }
  if (x1 < 1) {
    x1 = 0;
  }
  uVar1 = ptr->width;
  if ((int)uVar1 < x2) {
    x2 = uVar1;
  }
  if (x1 < x2) {
    uVar2 = 0;
    if (0 < y1) {
      uVar2 = (ulong)(uint)y1;
    }
    uVar3 = (ulong)(uint)y2;
    if (ptr->height < y2) {
      uVar3 = (ulong)(uint)ptr->height;
    }
    uVar5 = (ulong)(uint)x1;
    uVar6 = ((long)(int)uVar1 * uVar2 + uVar5) * 0x10 | 0xc;
    do {
      if ((int)uVar2 < (int)uVar3) {
        pfVar7 = (float *)((ptr->data).ptr + uVar6);
        lVar4 = uVar3 - uVar2;
        do {
          pfVar7[-3] = ptr->color[0];
          pfVar7[-2] = ptr->color[1];
          pfVar7[-1] = ptr->color[2];
          *pfVar7 = ptr->color[3];
          pfVar7 = pfVar7 + (long)(int)uVar1 * 4;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      uVar5 = uVar5 + 1;
      uVar6 = uVar6 + 0x10;
    } while (uVar5 != (uint)x2);
  }
  return;
}

Assistant:

void CanvasDrawRect(int x1, int y1, int x2, int y2, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		for(int x = x1 < 0 ? 0 : x1, xe = x2 > ptr->width ? ptr->width : x2; x < xe; x++)
		{
			for(int y = y1 < 0 ? 0 : y1, ye = y2 > ptr->height ? ptr->height : y2; y < ye; y++)
			{
				((float*)ptr->data.ptr)[(y*ptr->width + x) * 4 + 0] = ptr->color[0];
				((float*)ptr->data.ptr)[(y*ptr->width + x) * 4 + 1] = ptr->color[1];
				((float*)ptr->data.ptr)[(y*ptr->width + x) * 4 + 2] = ptr->color[2];
				((float*)ptr->data.ptr)[(y*ptr->width + x) * 4 + 3] = ptr->color[3];
			}
		}
	}